

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gsv_text.cpp
# Opt level: O3

uint __thiscall agg::gsv_text::vertex(gsv_text *this,double *x,double *y)

{
  int8 iVar1;
  char cVar2;
  int8 *piVar3;
  int8u *piVar4;
  int8u *piVar5;
  int8u *piVar6;
  int8u *piVar7;
  byte *pbVar8;
  ulong uVar9;
  status sVar10;
  int8u *piVar11;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  
  if ((this->m_flip & 1U) == 0) {
    dVar15 = this->m_height + this->m_line_space;
  }
  else {
    dVar15 = -this->m_height - this->m_line_space;
  }
  piVar3 = this->m_bglyph;
  sVar10 = this->m_status;
  dVar13 = this->m_y;
  dVar16 = this->m_x;
  pbVar8 = (byte *)this->m_cur_chr;
switchD_00116ada_default:
  switch(sVar10) {
  case initial:
    if (this->m_font == (void *)0x0) {
      return 0;
    }
    this->m_status = next_char;
    break;
  case start_glyph:
    goto switchD_00116ada_caseD_2;
  case glyph:
    goto switchD_00116ada_caseD_3;
  default:
    goto switchD_00116ada_default;
  }
  if (*pbVar8 == 0) {
    return 0;
  }
  this->m_cur_chr = (char *)(pbVar8 + 1);
  uVar9 = (ulong)*pbVar8;
  if (uVar9 != 10) {
    piVar4 = this->m_indices;
    bVar12 = this->m_big_endian != false;
    piVar7 = piVar4 + uVar9 * 2;
    piVar5 = piVar4 + uVar9 * 2 + 1;
    if (bVar12) {
      piVar7 = piVar4 + uVar9 * 2 + 1;
      piVar5 = piVar4 + uVar9 * 2;
    }
    piVar11 = piVar4 + uVar9 * 2 + 2;
    piVar6 = piVar4 + uVar9 * 2 + 3;
    if (bVar12) {
      piVar11 = piVar4 + uVar9 * 2 + 3;
      piVar6 = piVar4 + uVar9 * 2 + 2;
    }
    this->m_bglyph = this->m_glyphs + CONCAT11(*piVar5,*piVar7);
    this->m_eglyph = this->m_glyphs + CONCAT11(*piVar6,*piVar11);
    goto switchD_00116ada_caseD_2;
  }
  this->m_x = this->m_start_x;
  dVar13 = dVar13 - dVar15;
  this->m_y = dVar13;
  sVar10 = next_char;
  dVar16 = this->m_start_x;
  pbVar8 = pbVar8 + 1;
  goto switchD_00116ada_default;
switchD_00116ada_caseD_3:
  if (piVar3 < this->m_eglyph) {
    this->m_bglyph = piVar3 + 1;
    iVar1 = *piVar3;
    this->m_bglyph = piVar3 + 2;
    cVar2 = piVar3[1];
    auVar14 = ZEXT216(CONCAT11((char)(cVar2 * '\x02') >> 1,iVar1));
    auVar14 = pmovsxbd(auVar14,auVar14);
    dVar16 = this->m_w * (double)auVar14._0_4_ + dVar16;
    this->m_x = dVar16;
    this->m_y = this->m_h * (double)auVar14._4_4_ + dVar13;
    *x = dVar16;
    *y = this->m_y;
    return (-1 < cVar2) + 1;
  }
  this->m_status = next_char;
  this->m_x = this->m_space + dVar16;
  sVar10 = next_char;
  dVar16 = dVar16 + this->m_space;
  goto switchD_00116ada_default;
switchD_00116ada_caseD_2:
  *x = dVar16;
  *y = this->m_y;
  this->m_status = glyph;
  return 1;
}

Assistant:

unsigned gsv_text::vertex(double* x, double* y)
    {
        unsigned idx;
        int8 yc, yf;
        int dx, dy;
        bool quit = false;
        
        while(!quit)
        {
            switch(m_status)
            {
            case initial:
                if(m_font == 0) 
                {
                    quit = true;
                    break;
                }
                m_status = next_char;

            case next_char:
                if(*m_cur_chr == 0) 
                {
                    quit = true;
                    break;
                }
                idx = (*m_cur_chr++) & 0xFF;
                if(idx == '\n')
                {
                    m_x = m_start_x;
                    m_y -= m_flip ? -m_height - m_line_space : m_height + m_line_space;
                    break;
                }
                idx <<= 1;
                m_bglyph = m_glyphs + value(m_indices + idx);
                m_eglyph = m_glyphs + value(m_indices + idx + 2);
                m_status = start_glyph;

            case start_glyph:
                *x = m_x;
                *y = m_y;
                m_status = glyph;
                return path_cmd_move_to;

            case glyph:
                if(m_bglyph >= m_eglyph)
                {
                    m_status = next_char;
                    m_x += m_space;
                    break;
                }
                dx = int(*m_bglyph++);
                yf = (yc = *m_bglyph++) & 0x80;
                yc <<= 1; 
                yc >>= 1;
                dy = int(yc);
                m_x += double(dx) * m_w;
                m_y += double(dy) * m_h;
                *x = m_x;
                *y = m_y;
                return yf ? path_cmd_move_to : path_cmd_line_to;
            }

        }
        return path_cmd_stop;
    }